

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::PatternMatcher::checkPatternsMatches(PatternMatcher *this)

{
  _Rb_tree_node_base *__x;
  size_type sVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  
  for (p_Var4 = (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->patterns)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    __x = p_Var4 + 1;
    sVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->patternsMatched,(key_type *)__x);
    if (sVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"warning: Asyncify ");
      poVar2 = std::operator<<(poVar2,(string *)this);
      poVar2 = std::operator<<(poVar2,"list contained a non-matching pattern: ");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->unescaped,(key_type *)__x);
      poVar2 = std::operator<<(poVar2,(string *)pmVar3);
      poVar2 = std::operator<<(poVar2," (");
      poVar2 = std::operator<<(poVar2,(string *)__x);
      std::operator<<(poVar2,")\n");
    }
  }
  return;
}

Assistant:

void checkPatternsMatches() {
    for (auto& pattern : patterns) {
      if (patternsMatched.count(pattern) == 0) {
        std::cerr << "warning: Asyncify " << designation
                  << "list contained a non-matching pattern: "
                  << unescaped[pattern] << " (" << pattern << ")\n";
      }
    }
  }